

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

string * __thiscall
phosg::format_size_abi_cxx11_
          (string *__return_storage_ptr__,phosg *this,size_t size,bool include_bytes)

{
  float local_bc;
  float local_b4;
  float local_ac;
  float local_a4;
  float local_9c;
  float local_94;
  float local_84;
  float local_74;
  float local_64;
  float local_54;
  float local_44;
  float local_34;
  bool include_bytes_local;
  size_t size_local;
  
  if (this < (phosg *)0x400) {
    string_printf_abi_cxx11_(__return_storage_ptr__,"%zu bytes",this);
  }
  else if ((size & 1) == 0) {
    if (this < (phosg *)0x100000) {
      local_94 = (float)this;
      string_printf_abi_cxx11_(__return_storage_ptr__,"%.02f KB",(double)(local_94 / 1024.0));
    }
    else if (this < (phosg *)0x40000000) {
      local_9c = (float)this;
      string_printf_abi_cxx11_(__return_storage_ptr__,"%.02f MB",(double)(local_9c / 1048576.0));
    }
    else if (this < (phosg *)0x10000000000) {
      local_a4 = (float)this;
      string_printf_abi_cxx11_(__return_storage_ptr__,"%.02f GB",(double)(local_a4 / 1.0737418e+09))
      ;
    }
    else if (this < (phosg *)0x4000000000000) {
      local_ac = (float)this;
      string_printf_abi_cxx11_(__return_storage_ptr__,"%.02f TB",(double)(local_ac / 1.0995116e+12))
      ;
    }
    else if (this < (phosg *)0x1000000000000000) {
      local_b4 = (float)this;
      string_printf_abi_cxx11_(__return_storage_ptr__,"%.02f PB",(double)(local_b4 / 1.1258999e+15))
      ;
    }
    else {
      local_bc = (float)this;
      string_printf_abi_cxx11_(__return_storage_ptr__,"%.02f EB",(double)(local_bc / 1.1529215e+18))
      ;
    }
  }
  else if (this < (phosg *)0x100000) {
    local_34 = (float)this;
    string_printf_abi_cxx11_
              (__return_storage_ptr__,"%zu bytes (%.02f KB)",(double)(local_34 / 1024.0),this);
  }
  else if (this < (phosg *)0x40000000) {
    local_44 = (float)this;
    string_printf_abi_cxx11_
              (__return_storage_ptr__,"%zu bytes (%.02f MB)",(double)(local_44 / 1048576.0),this);
  }
  else if (this < (phosg *)0x10000000000) {
    local_54 = (float)this;
    string_printf_abi_cxx11_
              (__return_storage_ptr__,"%zu bytes (%.02f GB)",(double)(local_54 / 1.0737418e+09),this
              );
  }
  else if (this < (phosg *)0x4000000000000) {
    local_64 = (float)this;
    string_printf_abi_cxx11_
              (__return_storage_ptr__,"%zu bytes (%.02f TB)",(double)(local_64 / 1.0995116e+12),this
              );
  }
  else if (this < (phosg *)0x1000000000000000) {
    local_74 = (float)this;
    string_printf_abi_cxx11_
              (__return_storage_ptr__,"%zu bytes (%.02f PB)",(double)(local_74 / 1.1258999e+15),this
              );
  }
  else {
    local_84 = (float)this;
    string_printf_abi_cxx11_
              (__return_storage_ptr__,"%zu bytes (%.02f EB)",(double)(local_84 / 1.1529215e+18),this
              );
  }
  return __return_storage_ptr__;
}

Assistant:

string format_size(size_t size, bool include_bytes) {
  if (size < KB_SIZE) {
    return string_printf("%zu bytes", size);
  }
  if (include_bytes) {
    if (size < MB_SIZE) {
      return string_printf("%zu bytes (%.02f KB)", size, (float)size / KB_SIZE);
    }
    if (size < GB_SIZE) {
      return string_printf("%zu bytes (%.02f MB)", size, (float)size / MB_SIZE);
    }
    if (size < TB_SIZE) {
      return string_printf("%zu bytes (%.02f GB)", size, (float)size / GB_SIZE);
    }
    if (size < PB_SIZE) {
      return string_printf("%zu bytes (%.02f TB)", size, (float)size / TB_SIZE);
    }
    if (size < EB_SIZE) {
      return string_printf("%zu bytes (%.02f PB)", size, (float)size / PB_SIZE);
    }
    return string_printf("%zu bytes (%.02f EB)", size, (float)size / EB_SIZE);
  } else {
    if (size < MB_SIZE) {
      return string_printf("%.02f KB", (float)size / KB_SIZE);
    }
    if (size < GB_SIZE) {
      return string_printf("%.02f MB", (float)size / MB_SIZE);
    }
    if (size < TB_SIZE) {
      return string_printf("%.02f GB", (float)size / GB_SIZE);
    }
    if (size < PB_SIZE) {
      return string_printf("%.02f TB", (float)size / TB_SIZE);
    }
    if (size < EB_SIZE) {
      return string_printf("%.02f PB", (float)size / PB_SIZE);
    }
    return string_printf("%.02f EB", (float)size / EB_SIZE);
  }
}